

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O3

gnode_t * glist_insert_float64(gnode_t *gn,float64 val)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/glist.c"
                          ,0xf8);
  (pgVar1->data).fl = (double)val;
  pgVar1->next = gn->next;
  gn->next = pgVar1;
  return pgVar1;
}

Assistant:

gnode_t *
glist_insert_float64(gnode_t * gn, float64 val)
{
    gnode_t *newgn;

    newgn = (gnode_t *) ckd_calloc(1, sizeof(gnode_t));
    newgn->data.fl = (double)val;
    newgn->next = gn->next;
    gn->next = newgn;

    return newgn;
}